

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O2

float duckdb::DecimalAddOverflowCheck::Operation<float,float,float>(float left,float right)

{
  OutOfRangeException *this;
  bool bVar1;
  allocator local_45;
  float local_44;
  float local_40;
  float result;
  string local_38;
  
  local_44 = left;
  local_40 = right;
  bVar1 = TryDecimalAdd::Operation<float,float,float>(left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an explicit cast to a bigger decimal."
             ,&local_45);
  OutOfRangeException::OutOfRangeException<float,float>(this,&local_38,local_44,local_40);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryDecimalAdd::Operation<TA, TB, TR>(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an "
			                          "explicit cast to a bigger decimal.",
			                          left, right);
		}
		return result;
	}